

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

string * bf_crc::bool_to_str_abi_cxx11_(bool v)

{
  byte bVar1;
  byte in_SIL;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  string *__s;
  
  bVar1 = in_SIL & 1;
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (unaff_retaddr,(char *)__s,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffff0))
  ;
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff6);
  return in_RDI;
}

Assistant:

std::string bf_crc::bool_to_str(bool v) { 
  return v ? "true" : "false"; 
}